

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

FADFADSTATE * FADcos(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FADFADSTATE *cosa;
  Fad<double> cosaval;
  Fad<double> sinaval;
  FadExpr<FadUnaryMin<Fad<double>_>_> local_b0;
  FadExpr<FadFuncSin<Fad<double>_>_> local_a8;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> local_80;
  Fad<double> local_70;
  Fad<double> local_50;
  
  sin<double>(&local_a8,&x->val_);
  Fad<double>::Fad<FadFuncSin<Fad<double>>>(&local_50,&local_a8);
  Fad<double>::~Fad(&local_a8.fadexpr_.expr_);
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)&local_a8,&x->val_);
  Fad<double>::Fad<FadFuncCos<Fad<double>>>
            (&local_70,(FadExpr<FadFuncCos<Fad<double>_>_> *)&local_a8);
  Fad<double>::~Fad(&local_a8.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_70);
  uVar1 = 0;
  uVar2 = (ulong)sz;
  if ((int)sz < 1) {
    uVar2 = uVar1;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    local_b0.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)&local_50;
    Fad<Fad<double>_>::dx((Fad<double> *)&local_a8,x,(int)uVar3);
    local_80.fadexpr_.left_ = &local_b0;
    local_80.fadexpr_.right_ = (Fad<double> *)&local_a8;
    Fad<double>::operator=
              ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + uVar1),
               &local_80);
    Fad<double>::~Fad((Fad<double> *)&local_a8);
    uVar1 = uVar1 + 0x20;
  }
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADcos(FADFADSTATE x)
{
    Fad<STATE> sinaval = sin(x.val());
    Fad<STATE> cosaval = cos(x.val());
    int sz = x.size();
    FADFADSTATE cosa(sz,cosaval);
    for (int i=0; i<sz; i++) {
        cosa.fastAccessDx(i) = -sinaval*x.dx(i);
    }
    return cosa;
}